

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_test.cpp
# Opt level: O3

void __thiscall
HenyeyGreenstein_SamplingOrientationBackward_Test::TestBody
          (HenyeyGreenstein_SamplingOrientationBackward_Test *this)

{
  bool bVar1;
  int iVar2;
  char *message;
  int iVar3;
  int iVar4;
  Point2f u;
  undefined8 uVar5;
  Vector3f VVar6;
  int nBackward;
  Float pdf;
  Uniform2DIter __begin1;
  int local_6c;
  Message local_68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  Uniform2DIter local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_6c = 0;
  iVar3 = 0;
  iVar4 = 0;
  local_50.super_RNGIterator<pbrt::detail::Uniform2DIter>.
  super_IndexingIterator<pbrt::detail::Uniform2DIter>.i = 0;
  local_50.super_RNGIterator<pbrt::detail::Uniform2DIter>.
  super_IndexingIterator<pbrt::detail::Uniform2DIter>.n = 100;
  local_50.super_RNGIterator<pbrt::detail::Uniform2DIter>.rng.inc = 1;
  local_50.super_RNGIterator<pbrt::detail::Uniform2DIter>.rng.state =
       (uint64_t)&DAT_5851f42d4c957f2e;
  do {
    u = pbrt::detail::Uniform2DIter::operator*(&local_50);
    VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_ = SUB648(ZEXT464(0xbf800000),0);
    VVar6.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    uVar5 = 0;
    VVar6 = pbrt::SampleHenyeyGreenstein(VVar6,-0.95,u,(Float *)&local_68);
    local_38 = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_68.ss_.ptr_._0_4_ = CONCAT31(local_68.ss_.ptr_._1_3_,1);
    local_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    uStack_30 = uVar5;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((float)local_38 <= 0.0) {
      iVar3 = iVar3 + 1;
      local_6c = iVar3;
    }
    else {
      iVar4 = iVar4 + 1;
    }
    iVar2 = local_50.super_RNGIterator<pbrt::detail::Uniform2DIter>.
            super_IndexingIterator<pbrt::detail::Uniform2DIter>.i + 1;
    local_50.super_RNGIterator<pbrt::detail::Uniform2DIter>.
    super_IndexingIterator<pbrt::detail::Uniform2DIter>.i = iVar2;
  } while (iVar2 != 100);
  local_68.ss_.ptr_._0_4_ = iVar4 * 10;
  testing::internal::CmpHelperGE<int,int>
            ((internal *)&local_50,"nBackward","10 * nForward",&local_6c,(int *)&local_68);
  if (local_50.super_RNGIterator<pbrt::detail::Uniform2DIter>.
      super_IndexingIterator<pbrt::detail::Uniform2DIter>.i._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_68);
    if ((undefined8 *)local_50.super_RNGIterator<pbrt::detail::Uniform2DIter>.rng.state ==
        (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_50.super_RNGIterator<pbrt::detail::Uniform2DIter>.rng.state;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/media_test.cpp"
               ,0x3e,message);
    testing::internal::AssertHelper::operator=(&local_58,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (CONCAT44(local_68.ss_.ptr_._4_4_,(int)local_68.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_68.ss_.ptr_._4_4_,(int)local_68.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_68.ss_.ptr_._4_4_,(int)local_68.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50.super_RNGIterator<pbrt::detail::Uniform2DIter>.rng,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(HenyeyGreenstein, SamplingOrientationBackward) {
    HGPhaseFunction hg(-0.95);
    Vector3f wo(-1, 0, 0);
    int nForward = 0, nBackward = 0;
    for (Point2f u : Uniform2D(100)) {
        auto ps = hg.Sample_p(wo, u);
        EXPECT_TRUE(ps.has_value());
        if (ps->wi.x > 0)
            ++nForward;
        else
            ++nBackward;
    }
    // With g = -0.95, almost all of the samples should have wi.x < 0.
    EXPECT_GE(nBackward, 10 * nForward);
}